

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

counting_iterator __thiscall
duckdb_fmt::v6::internal::float_writer<char>::prettify<duckdb_fmt::v6::internal::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  counting_iterator cVar8;
  int i;
  int iVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  size_t sVar16;
  
  uVar12 = this->num_digits_;
  uVar14 = this->exp_;
  lVar15 = (long)(int)uVar12;
  uVar6 = uVar14 + uVar12;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    lVar13 = (this->specs_).precision - lVar15;
    bVar11 = (byte)(uVar1 >> 0x1d) & 0 < (int)lVar13;
    lVar5 = it.count_ + lVar15 + (ulong)(1 < (int)uVar12 | bVar11);
    lVar15 = 0;
    if (bVar11 != 0) {
      lVar15 = lVar13;
    }
    uVar6 = uVar6 - 1;
    lVar13 = lVar15 + lVar5 + 2;
    uVar12 = -uVar6;
    if (0 < (int)uVar6) {
      uVar12 = uVar6;
    }
    lVar15 = lVar15 + 3 + lVar5;
    if (uVar12 < 1000) {
      lVar15 = lVar13;
    }
    lVar15 = lVar15 + 1;
    if (uVar12 < 100) {
      lVar15 = lVar13;
    }
    return (counting_iterator)(lVar15 + 2);
  }
  if (-1 < (int)uVar14) {
    if ((int)uVar6 < 4 || (uVar1 & 0xff0000) == 0) {
      cVar8.count_ = lVar15 + it.count_;
      if (uVar12 == 0) {
        cVar8.count_ = it.count_;
      }
      it.count_ = cVar8.count_ + uVar14;
    }
    else {
      uVar14 = 3;
      if (uVar6 % 3 != 0) {
        uVar14 = uVar6 % 3;
      }
      iVar9 = 0;
      do {
        lVar15 = (0 < iVar9) + it.count_;
        uVar10 = uVar12 - iVar9;
        if (uVar10 == 0 || (int)uVar12 < iVar9) {
          it.count_ = lVar15 + (ulong)uVar14;
        }
        else {
          uVar4 = uVar10;
          if ((int)uVar14 < (int)uVar10) {
            uVar4 = uVar14;
          }
          it.count_ = lVar15 + (int)uVar4;
          if ((int)uVar10 < (int)uVar14) {
            uVar10 = uVar14 - uVar4;
            if ((int)(uVar14 - uVar4) < 1) {
              uVar10 = 0;
            }
            it.count_ = it.count_ + uVar10;
          }
        }
        iVar9 = iVar9 + uVar14;
        uVar14 = 3;
      } while (iVar9 < (int)uVar6);
    }
    if ((uVar1 >> 0x1d & 1) == 0) {
      return (counting_iterator)it.count_;
    }
    iVar9 = (this->specs_).precision;
    iVar7 = iVar9 - uVar6;
    if (iVar7 != 0 && (int)uVar6 <= iVar9) {
      return (counting_iterator)(it.count_ + (iVar7 - 1) + 2);
    }
    return (counting_iterator)((it.count_ - ((uVar1 & 0xff) == 2)) + 2);
  }
  if (0 < (int)uVar6) {
    if (uVar6 < 4 || (uVar1 & 0xff0000) == 0) {
      it.count_ = it.count_ + uVar6;
    }
    else {
      uVar14 = uVar6 % 3;
      if (uVar6 % 3 == 0) {
        uVar14 = 3;
      }
      iVar9 = 0;
      do {
        it.count_ = (0 < iVar9) + it.count_ + (ulong)uVar14;
        iVar9 = iVar9 + uVar14;
        uVar14 = 3;
      } while (iVar9 < (int)uVar6);
    }
    if ((uVar1 >> 0x1d & 1) != 0) {
      lVar15 = (it.count_ - uVar6) + lVar15;
      sVar16 = lVar15 + 1;
      iVar9 = (this->specs_).precision;
      iVar7 = iVar9 - uVar12;
      if (iVar7 == 0 || iVar9 < (int)uVar12) {
        return (counting_iterator)sVar16;
      }
      if (iVar7 < 1) {
        return (counting_iterator)sVar16;
      }
      return (counting_iterator)(lVar15 + 2 + (ulong)(iVar7 - 1));
    }
    uVar14 = uVar12 - 1;
    if ((int)uVar6 < (int)(uVar12 - 1)) {
      uVar14 = uVar6;
    }
    do {
      if (this->digits_[lVar15 + -1] != '0') {
        uVar14 = (uint)lVar15;
        break;
      }
      lVar15 = lVar15 + -1;
    } while ((long)(ulong)uVar6 < lVar15);
    sVar16 = it.count_ + (uVar14 != uVar6);
    if (uVar6 != uVar14) {
      return (counting_iterator)((sVar16 - uVar6) + (long)(int)uVar14);
    }
    return (counting_iterator)sVar16;
  }
  iVar7 = -uVar6;
  iVar9 = iVar7;
  if (uVar12 == 0) {
    iVar2 = (this->specs_).precision;
    if (SBORROW4(iVar2,iVar7) != (int)(iVar2 + uVar6) < 0) {
      iVar9 = iVar2;
    }
    if (iVar2 < 0) {
      iVar9 = iVar7;
    }
  }
  else {
    if ((int)uVar12 < 1 || (uVar1 >> 0x1d & 1) != 0) goto LAB_00d7d02d;
    do {
      if (this->digits_[(ulong)uVar12 - 1] != '0') goto LAB_00d7d02d;
      bVar3 = 1 < (int)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar3);
  }
  iVar7 = iVar9;
  uVar12 = 0;
  if (iVar7 == 0) {
    return (counting_iterator)(it.count_ + 1);
  }
LAB_00d7d02d:
  lVar15 = it.count_ + 3 + (ulong)(iVar7 - 1);
  if (iVar7 < 1) {
    lVar15 = it.count_ + 2;
  }
  return (counting_iterator)((int)uVar12 + lVar15);
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }